

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineDepthTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::testSupportsDepthStencilFormat
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format)

{
  InstanceInterface *pIVar1;
  VkPhysicalDevice pVVar2;
  VkFormatProperties formatProps;
  undefined8 local_40;
  long local_38;
  long local_30 [2];
  
  pIVar1 = Context::getInstanceInterface(context);
  pVVar2 = Context::getPhysicalDevice(context);
  (*pIVar1->_vptr_InstanceInterface[3])(pIVar1,pVVar2,(ulong)format,&local_40);
  if ((local_40._4_4_ >> 9 & 1) == 0) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unsupported depth/stencil attachment format","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_40,local_38 + (long)local_40);
  }
  else {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Format can be used in depth/stencil attachment","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_40,local_38 + (long)local_40);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testSupportsDepthStencilFormat (Context& context, VkFormat format)
{
	DE_ASSERT(vk::isDepthStencilFormat(format));

	if (isSupportedDepthStencilFormat(context.getInstanceInterface(), context.getPhysicalDevice(), format))
		return tcu::TestStatus::pass("Format can be used in depth/stencil attachment");
	else
		return tcu::TestStatus::fail("Unsupported depth/stencil attachment format");
}